

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_kotlin.cpp
# Opt level: O0

string * flatbuffers::kotlin::KotlinGenerator::CastToSigned_abi_cxx11_(Type type)

{
  Type type_00;
  string *in_RDI;
  BaseType in_stack_00000008;
  undefined8 in_stack_ffffffffffffff68;
  allocator<char> *__a;
  allocator<char> local_49;
  Type local_48;
  allocator<char> local_27;
  allocator<char> local_26;
  allocator<char> local_25 [20];
  allocator<char> local_11 [9];
  
  switch(in_stack_00000008) {
  case BASE_TYPE_UTYPE:
  case BASE_TYPE_UCHAR:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)in_RDI,".toByte()",local_25);
    std::allocator<char>::~allocator(local_25);
    break;
  default:
    __a = &local_49;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)in_RDI,"",__a);
    std::allocator<char>::~allocator(&local_49);
    break;
  case BASE_TYPE_USHORT:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)in_RDI,".toShort()",&local_26);
    std::allocator<char>::~allocator(&local_26);
    break;
  case BASE_TYPE_UINT:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)in_RDI,".toInt()",local_11);
    std::allocator<char>::~allocator(local_11);
    break;
  case BASE_TYPE_ULONG:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)in_RDI,".toLong()",&local_27);
    std::allocator<char>::~allocator(&local_27);
    break;
  case BASE_TYPE_VECTOR:
    Type::VectorType(&local_48,(Type *)&stack0x00000008);
    type_00.struct_def = (StructDef *)local_48.enum_def;
    type_00._0_8_ = local_48.struct_def;
    type_00.enum_def = (EnumDef *)local_48._24_8_;
    type_00._24_8_ = in_stack_ffffffffffffff68;
    CastToSigned_abi_cxx11_(type_00);
  }
  return in_RDI;
}

Assistant:

static std::string CastToSigned(const Type type) {
    switch (type.base_type) {
      case BASE_TYPE_UINT: return ".toInt()";
      case BASE_TYPE_UCHAR:
      case BASE_TYPE_UTYPE: return ".toByte()";
      case BASE_TYPE_USHORT: return ".toShort()";
      case BASE_TYPE_ULONG: return ".toLong()";
      case BASE_TYPE_VECTOR: return CastToSigned(type.VectorType());
      default: return "";
    }
  }